

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void Utils::calculate_distances(void)

{
  Point *this;
  Point *p;
  list<Point_*,_std::allocator<Point_*>_> *plVar1;
  list<Point_*,_std::allocator<Point_*>_> *plVar2;
  iterator __end1;
  double dVar3;
  
  plVar1 = &raw_rows_abi_cxx11_;
  while (plVar1 = (list<Point_*,_std::allocator<Point_*>_> *)
                  (plVar1->super__List_base<Point_*,_std::allocator<Point_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next, plVar1 != &raw_rows_abi_cxx11_) {
    this = *(Point **)((long)plVar1 + 0x10);
    plVar2 = &raw_rows_abi_cxx11_;
    while (plVar2 = (list<Point_*,_std::allocator<Point_*>_> *)
                    (plVar2->super__List_base<Point_*,_std::allocator<Point_*>_>)._M_impl._M_node.
                    super__List_node_base._M_next, plVar2 != &raw_rows_abi_cxx11_) {
      p = *(Point **)((long)plVar2 + 0x10);
      dVar3 = Point::distance(this,p);
      distances[this->id][p->id] = dVar3;
    }
  }
  return;
}

Assistant:

void Utils::calculate_distances() {
    for (Point *point: Utils::raw_rows) {
        for (Point *point2: Utils::raw_rows) {
            Utils::distances[point->id][point2->id] = point->distance(point2);
        }
    }
}